

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::DataTypeSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((((kind == BitType) || (kind - ByteType < 2)) || (kind == EnumType)) ||
        (((kind == EventType || (kind == ImplicitType)) ||
         ((kind == IntType || ((kind == IntegerType || (kind == LogicType)))))))) ||
       ((kind == LongIntType ||
        (((kind == NamedType || (kind == PropertyType)) || (kind - RealTimeType < 3)))))) ||
      (((kind == SequenceType || (kind - ShortIntType < 2)) ||
       (((kind == StringType || ((kind == StructType || (kind == TimeType)))) ||
        (kind == TypeReference)))))) ||
     ((((kind == UnionType || (kind == Untyped)) || (kind == VirtualInterfaceType)) ||
      (kind == VoidType)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DataTypeSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BitType:
        case SyntaxKind::ByteType:
        case SyntaxKind::CHandleType:
        case SyntaxKind::EnumType:
        case SyntaxKind::EventType:
        case SyntaxKind::ImplicitType:
        case SyntaxKind::IntType:
        case SyntaxKind::IntegerType:
        case SyntaxKind::LogicType:
        case SyntaxKind::LongIntType:
        case SyntaxKind::NamedType:
        case SyntaxKind::PropertyType:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::RealType:
        case SyntaxKind::RegType:
        case SyntaxKind::SequenceType:
        case SyntaxKind::ShortIntType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::StringType:
        case SyntaxKind::StructType:
        case SyntaxKind::TimeType:
        case SyntaxKind::TypeReference:
        case SyntaxKind::UnionType:
        case SyntaxKind::Untyped:
        case SyntaxKind::VirtualInterfaceType:
        case SyntaxKind::VoidType:
            return true;
        default:
            return false;
    }
}